

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage6_high32_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i alVar74;
  undefined1 auVar75 [16];
  __m128i alVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  __m128i alVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar7 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar8 [16];
  undefined1 auVar13 [16];
  undefined1 auVar18 [16];
  undefined1 auVar23 [16];
  undefined1 auVar28 [16];
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  undefined1 auVar19 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  alVar74 = x[0x22];
  alVar76 = x[0x23];
  alVar1 = x[0x24];
  alVar2 = x[0x25];
  auVar71._0_12_ = alVar74._0_12_;
  auVar71._12_2_ = alVar74[0]._6_2_;
  auVar71._14_2_ = *(undefined2 *)((long)x[0x3d] + 6);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = alVar74._0_10_;
  auVar70._10_2_ = *(undefined2 *)((long)x[0x3d] + 4);
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._0_8_ = alVar74[0];
  auVar69._8_2_ = alVar74[0]._4_2_;
  auVar68._8_8_ = auVar69._8_8_;
  auVar68._6_2_ = *(undefined2 *)((long)x[0x3d] + 2);
  auVar68._4_2_ = alVar74[0]._2_2_;
  auVar68._0_2_ = (undefined2)alVar74[0];
  auVar68._2_2_ = (short)x[0x3d][0];
  auVar55._2_2_ = (short)x[0x3d][1];
  auVar55._0_2_ = (short)alVar74[1];
  auVar55._4_2_ = alVar74[1]._2_2_;
  auVar55._6_2_ = *(undefined2 *)((long)x[0x3d] + 10);
  auVar55._8_2_ = alVar74[1]._4_2_;
  auVar55._10_2_ = *(undefined2 *)((long)x[0x3d] + 0xc);
  auVar55._12_2_ = alVar74[1]._6_2_;
  auVar55._14_2_ = *(undefined2 *)((long)x[0x3d] + 0xe);
  auVar50._8_4_ = 0x31ff04f;
  auVar50._0_8_ = 0x31ff04f031ff04f;
  auVar50._12_4_ = 0x31ff04f;
  auVar78 = pmaddwd(auVar68,auVar50);
  auVar82 = pmaddwd(auVar55,auVar50);
  auVar43._8_4_ = 0xfb1031f;
  auVar43._0_8_ = 0xfb1031f0fb1031f;
  auVar43._12_4_ = 0xfb1031f;
  auVar72 = pmaddwd(auVar68,auVar43);
  auVar56 = pmaddwd(auVar55,auVar43);
  auVar79._0_4_ = auVar78._0_4_ + in_XMM0_Da >> 0xc;
  auVar79._4_4_ = auVar78._4_4_ + in_XMM0_Db >> 0xc;
  auVar79._8_4_ = auVar78._8_4_ + in_XMM0_Dc >> 0xc;
  auVar79._12_4_ = auVar78._12_4_ + in_XMM0_Dd >> 0xc;
  auVar83._0_4_ = auVar82._0_4_ + in_XMM0_Da >> 0xc;
  auVar83._4_4_ = auVar82._4_4_ + in_XMM0_Db >> 0xc;
  auVar83._8_4_ = auVar82._8_4_ + in_XMM0_Dc >> 0xc;
  auVar83._12_4_ = auVar82._12_4_ + in_XMM0_Dd >> 0xc;
  alVar80 = (__m128i)packssdw(auVar79,auVar83);
  auVar73._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar73._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar73._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar73._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  auVar57._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar57._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar57._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar57._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar73,auVar57);
  x[0x22] = alVar80;
  x[0x3d] = alVar74;
  auVar61._0_12_ = alVar76._0_12_;
  auVar61._12_2_ = alVar76[0]._6_2_;
  auVar61._14_2_ = *(undefined2 *)((long)x[0x3c] + 6);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = alVar76._0_10_;
  auVar60._10_2_ = *(undefined2 *)((long)x[0x3c] + 4);
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._0_8_ = alVar76[0];
  auVar59._8_2_ = alVar76[0]._4_2_;
  auVar58._8_8_ = auVar59._8_8_;
  auVar58._6_2_ = *(undefined2 *)((long)x[0x3c] + 2);
  auVar58._4_2_ = alVar76[0]._2_2_;
  auVar58._0_2_ = (undefined2)alVar76[0];
  auVar58._2_2_ = (short)x[0x3c][0];
  auVar31._2_2_ = (short)x[0x3c][1];
  auVar31._0_2_ = (short)alVar76[1];
  auVar31._4_2_ = alVar76[1]._2_2_;
  auVar31._6_2_ = *(undefined2 *)((long)x[0x3c] + 10);
  auVar31._8_2_ = alVar76[1]._4_2_;
  auVar31._10_2_ = *(undefined2 *)((long)x[0x3c] + 0xc);
  auVar31._12_2_ = alVar76[1]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x3c] + 0xe);
  auVar78 = pmaddwd(auVar58,auVar50);
  auVar82 = pmaddwd(auVar31,auVar50);
  auVar72 = pmaddwd(auVar58,auVar43);
  auVar56 = pmaddwd(auVar31,auVar43);
  auVar75._0_4_ = auVar78._0_4_ + in_XMM0_Da >> 0xc;
  auVar75._4_4_ = auVar78._4_4_ + in_XMM0_Db >> 0xc;
  auVar75._8_4_ = auVar78._8_4_ + in_XMM0_Dc >> 0xc;
  auVar75._12_4_ = auVar78._12_4_ + in_XMM0_Dd >> 0xc;
  auVar81._0_4_ = auVar82._0_4_ + in_XMM0_Da >> 0xc;
  auVar81._4_4_ = auVar82._4_4_ + in_XMM0_Db >> 0xc;
  auVar81._8_4_ = auVar82._8_4_ + in_XMM0_Dc >> 0xc;
  auVar81._12_4_ = auVar82._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar75,auVar81);
  auVar62._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar62._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar62._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar62._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  auVar32._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar62,auVar32);
  x[0x23] = alVar76;
  x[0x3c] = alVar74;
  auVar47._0_12_ = alVar1._0_12_;
  auVar47._12_2_ = alVar1[0]._6_2_;
  auVar47._14_2_ = *(undefined2 *)((long)x[0x3b] + 6);
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = alVar1._0_10_;
  auVar46._10_2_ = *(undefined2 *)((long)x[0x3b] + 4);
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._0_8_ = alVar1[0];
  auVar45._8_2_ = alVar1[0]._4_2_;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._6_2_ = *(undefined2 *)((long)x[0x3b] + 2);
  auVar44._4_2_ = alVar1[0]._2_2_;
  auVar44._0_2_ = (undefined2)alVar1[0];
  auVar44._2_2_ = (short)x[0x3b][0];
  auVar4._2_2_ = (short)x[0x3b][1];
  auVar4._0_2_ = (short)alVar1[1];
  auVar4._4_2_ = alVar1[1]._2_2_;
  auVar4._6_2_ = *(undefined2 *)((long)x[0x3b] + 10);
  auVar4._8_2_ = alVar1[1]._4_2_;
  auVar4._10_2_ = *(undefined2 *)((long)x[0x3b] + 0xc);
  auVar4._12_2_ = alVar1[1]._6_2_;
  auVar4._14_2_ = *(undefined2 *)((long)x[0x3b] + 0xe);
  auVar33._8_4_ = 0xf04ffce1;
  auVar33._0_8_ = 0xf04ffce1f04ffce1;
  auVar33._12_4_ = 0xf04ffce1;
  auVar78 = pmaddwd(auVar44,auVar33);
  auVar82 = pmaddwd(auVar4,auVar33);
  auVar72 = pmaddwd(auVar44,auVar50);
  auVar56 = pmaddwd(auVar4,auVar50);
  auVar63._0_4_ = auVar78._0_4_ + in_XMM0_Da >> 0xc;
  auVar63._4_4_ = auVar78._4_4_ + in_XMM0_Db >> 0xc;
  auVar63._8_4_ = auVar78._8_4_ + in_XMM0_Dc >> 0xc;
  auVar63._12_4_ = auVar78._12_4_ + in_XMM0_Dd >> 0xc;
  auVar77._0_4_ = auVar82._0_4_ + in_XMM0_Da >> 0xc;
  auVar77._4_4_ = auVar82._4_4_ + in_XMM0_Db >> 0xc;
  auVar77._8_4_ = auVar82._8_4_ + in_XMM0_Dc >> 0xc;
  auVar77._12_4_ = auVar82._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar63,auVar77);
  auVar48._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  auVar5._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar5._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar5._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar5._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar48,auVar5);
  x[0x24] = alVar76;
  x[0x3b] = alVar74;
  auVar9._0_12_ = alVar2._0_12_;
  auVar9._12_2_ = alVar2[0]._6_2_;
  auVar9._14_2_ = *(undefined2 *)((long)x[0x3a] + 6);
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = alVar2._0_10_;
  auVar8._10_2_ = *(undefined2 *)((long)x[0x3a] + 4);
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = alVar2[0];
  auVar7._8_2_ = alVar2[0]._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = *(undefined2 *)((long)x[0x3a] + 2);
  auVar6._4_2_ = alVar2[0]._2_2_;
  auVar6._0_2_ = (undefined2)alVar2[0];
  auVar6._2_2_ = (short)x[0x3a][0];
  auVar56._2_2_ = (short)x[0x3a][1];
  auVar56._0_2_ = (short)alVar2[1];
  auVar56._4_2_ = alVar2[1]._2_2_;
  auVar56._6_2_ = *(undefined2 *)((long)x[0x3a] + 10);
  auVar56._8_2_ = alVar2[1]._4_2_;
  auVar56._10_2_ = *(undefined2 *)((long)x[0x3a] + 0xc);
  auVar56._12_2_ = alVar2[1]._6_2_;
  auVar56._14_2_ = *(undefined2 *)((long)x[0x3a] + 0xe);
  auVar82 = pmaddwd(auVar6,auVar33);
  auVar78 = pmaddwd(auVar33,auVar56);
  auVar72 = pmaddwd(auVar6,auVar50);
  auVar56 = pmaddwd(auVar56,auVar50);
  auVar49._0_4_ = auVar82._0_4_ + in_XMM0_Da >> 0xc;
  auVar49._4_4_ = auVar82._4_4_ + in_XMM0_Db >> 0xc;
  auVar49._8_4_ = auVar82._8_4_ + in_XMM0_Dc >> 0xc;
  auVar49._12_4_ = auVar82._12_4_ + in_XMM0_Dd >> 0xc;
  auVar34._0_4_ = auVar78._0_4_ + in_XMM0_Da >> 0xc;
  auVar34._4_4_ = auVar78._4_4_ + in_XMM0_Db >> 0xc;
  auVar34._8_4_ = auVar78._8_4_ + in_XMM0_Dc >> 0xc;
  auVar34._12_4_ = auVar78._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar49,auVar34);
  auVar10._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar10._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar10._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar10._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  auVar72._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar72._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar72._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar72._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar10,auVar72);
  x[0x25] = alVar76;
  x[0x3a] = alVar74;
  alVar74 = x[0x2a];
  auVar14._0_12_ = alVar74._0_12_;
  auVar14._12_2_ = alVar74[0]._6_2_;
  auVar14._14_2_ = *(undefined2 *)((long)x[0x35] + 6);
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = alVar74._0_10_;
  auVar13._10_2_ = *(undefined2 *)((long)x[0x35] + 4);
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = alVar74[0];
  auVar12._8_2_ = alVar74[0]._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = *(undefined2 *)((long)x[0x35] + 2);
  auVar11._4_2_ = alVar74[0]._2_2_;
  auVar11._0_2_ = (undefined2)alVar74[0];
  auVar11._2_2_ = (short)x[0x35][0];
  auVar35._2_2_ = (short)x[0x35][1];
  auVar35._0_2_ = (short)alVar74[1];
  auVar35._4_2_ = alVar74[1]._2_2_;
  auVar35._6_2_ = *(undefined2 *)((long)x[0x35] + 10);
  auVar35._8_2_ = alVar74[1]._4_2_;
  auVar35._10_2_ = *(undefined2 *)((long)x[0x35] + 0xc);
  auVar35._12_2_ = alVar74[1]._6_2_;
  auVar35._14_2_ = *(undefined2 *)((long)x[0x35] + 0xe);
  auVar78._8_4_ = 0xd4ef71c;
  auVar78._0_8_ = 0xd4ef71c0d4ef71c;
  auVar78._12_4_ = 0xd4ef71c;
  auVar50 = pmaddwd(auVar11,auVar78);
  auVar64 = pmaddwd(auVar35,auVar78);
  auVar82._8_4_ = 0x8e40d4e;
  auVar82._0_8_ = 0x8e40d4e08e40d4e;
  auVar82._12_4_ = 0x8e40d4e;
  auVar56 = pmaddwd(auVar11,auVar82);
  auVar72 = pmaddwd(auVar35,auVar82);
  auVar51._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar51._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar51._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar51._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  auVar65._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar65._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar65._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar65._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar51,auVar65);
  auVar15._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar15._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar15._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar15._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  auVar36._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar36._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar36._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar36._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar15,auVar36);
  x[0x2a] = alVar76;
  x[0x35] = alVar74;
  alVar74 = x[0x2b];
  auVar19._0_12_ = alVar74._0_12_;
  auVar19._12_2_ = alVar74[0]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)x[0x34] + 6);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = alVar74._0_10_;
  auVar18._10_2_ = *(undefined2 *)((long)x[0x34] + 4);
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = alVar74[0];
  auVar17._8_2_ = alVar74[0]._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = *(undefined2 *)((long)x[0x34] + 2);
  auVar16._4_2_ = alVar74[0]._2_2_;
  auVar16._0_2_ = (undefined2)alVar74[0];
  auVar16._2_2_ = (short)x[0x34][0];
  auVar37._2_2_ = (short)x[0x34][1];
  auVar37._0_2_ = (short)alVar74[1];
  auVar37._4_2_ = alVar74[1]._2_2_;
  auVar37._6_2_ = *(undefined2 *)((long)x[0x34] + 10);
  auVar37._8_2_ = alVar74[1]._4_2_;
  auVar37._10_2_ = *(undefined2 *)((long)x[0x34] + 0xc);
  auVar37._12_2_ = alVar74[1]._6_2_;
  auVar37._14_2_ = *(undefined2 *)((long)x[0x34] + 0xe);
  auVar50 = pmaddwd(auVar16,auVar78);
  auVar64 = pmaddwd(auVar37,auVar78);
  auVar56 = pmaddwd(auVar16,auVar82);
  auVar72 = pmaddwd(auVar37,auVar82);
  auVar52._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar52._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar52._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar52._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  auVar66._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar66._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar66._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar66._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar52,auVar66);
  auVar20._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar20._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar20._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar20._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  auVar38._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar20,auVar38);
  x[0x2b] = alVar76;
  x[0x34] = alVar74;
  alVar74 = x[0x2c];
  auVar24._0_12_ = alVar74._0_12_;
  auVar24._12_2_ = alVar74[0]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)x[0x33] + 6);
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._0_10_ = alVar74._0_10_;
  auVar23._10_2_ = *(undefined2 *)((long)x[0x33] + 4);
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._0_8_ = alVar74[0];
  auVar22._8_2_ = alVar74[0]._4_2_;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._6_2_ = *(undefined2 *)((long)x[0x33] + 2);
  auVar21._4_2_ = alVar74[0]._2_2_;
  auVar21._0_2_ = (undefined2)alVar74[0];
  auVar21._2_2_ = (short)x[0x33][0];
  auVar39._2_2_ = (short)x[0x33][1];
  auVar39._0_2_ = (short)alVar74[1];
  auVar39._4_2_ = alVar74[1]._2_2_;
  auVar39._6_2_ = *(undefined2 *)((long)x[0x33] + 10);
  auVar39._8_2_ = alVar74[1]._4_2_;
  auVar39._10_2_ = *(undefined2 *)((long)x[0x33] + 0xc);
  auVar39._12_2_ = alVar74[1]._6_2_;
  auVar39._14_2_ = *(undefined2 *)((long)x[0x33] + 0xe);
  auVar64._8_4_ = 0xf71cf2b2;
  auVar64._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar64._12_4_ = 0xf71cf2b2;
  auVar50 = pmaddwd(auVar21,auVar64);
  auVar82 = pmaddwd(auVar39,auVar64);
  auVar56 = pmaddwd(auVar21,auVar78);
  auVar72 = pmaddwd(auVar39,auVar78);
  auVar53._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar53._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar53._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar53._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  auVar67._0_4_ = auVar82._0_4_ + in_XMM0_Da >> 0xc;
  auVar67._4_4_ = auVar82._4_4_ + in_XMM0_Db >> 0xc;
  auVar67._8_4_ = auVar82._8_4_ + in_XMM0_Dc >> 0xc;
  auVar67._12_4_ = auVar82._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar53,auVar67);
  auVar25._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar25._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar25._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar25._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  auVar40._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar25,auVar40);
  x[0x2c] = alVar76;
  x[0x33] = alVar74;
  alVar74 = x[0x2d];
  auVar29._0_12_ = alVar74._0_12_;
  auVar29._12_2_ = alVar74[0]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)x[0x32] + 6);
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._0_10_ = alVar74._0_10_;
  auVar28._10_2_ = *(undefined2 *)((long)x[0x32] + 4);
  auVar27._10_6_ = auVar28._10_6_;
  auVar27._0_8_ = alVar74[0];
  auVar27._8_2_ = alVar74[0]._4_2_;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._6_2_ = *(undefined2 *)((long)x[0x32] + 2);
  auVar26._4_2_ = alVar74[0]._2_2_;
  auVar26._0_2_ = (undefined2)alVar74[0];
  auVar26._2_2_ = (short)x[0x32][0];
  auVar41._2_2_ = (short)x[0x32][1];
  auVar41._0_2_ = (short)alVar74[1];
  auVar41._4_2_ = alVar74[1]._2_2_;
  auVar41._6_2_ = *(undefined2 *)((long)x[0x32] + 10);
  auVar41._8_2_ = alVar74[1]._4_2_;
  auVar41._10_2_ = *(undefined2 *)((long)x[0x32] + 0xc);
  auVar41._12_2_ = alVar74[1]._6_2_;
  auVar41._14_2_ = *(undefined2 *)((long)x[0x32] + 0xe);
  auVar50 = pmaddwd(auVar26,auVar64);
  auVar56 = pmaddwd(auVar64,auVar41);
  auVar72 = pmaddwd(auVar26,auVar78);
  auVar78 = pmaddwd(auVar41,auVar78);
  auVar54._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar54._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar54._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar54._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  auVar3._0_4_ = auVar56._0_4_ + in_XMM0_Da >> 0xc;
  auVar3._4_4_ = auVar56._4_4_ + in_XMM0_Db >> 0xc;
  auVar3._8_4_ = auVar56._8_4_ + in_XMM0_Dc >> 0xc;
  auVar3._12_4_ = auVar56._12_4_ + in_XMM0_Dd >> 0xc;
  alVar76 = (__m128i)packssdw(auVar54,auVar3);
  auVar30._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar30._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar30._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar30._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  auVar42._0_4_ = auVar78._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar78._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar78._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar78._12_4_ + in_XMM0_Dd >> 0xc;
  alVar74 = (__m128i)packssdw(auVar30,auVar42);
  x[0x2d] = alVar76;
  x[0x32] = alVar74;
  return;
}

Assistant:

static inline void idct64_stage6_high32_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m56_m08 = pair_set_epi16(-cospi[56], -cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[34], x[61], x[34], x[61]);
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[35], x[60], x[35], x[60]);
  btf_16_sse2(cospi_m56_m08, cospi_m08_p56, x[36], x[59], x[36], x[59]);
  btf_16_sse2(cospi_m56_m08, cospi_m08_p56, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m40_p24, cospi_p24_p40, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m40_p24, cospi_p24_p40, x[43], x[52], x[43], x[52]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[44], x[51], x[44], x[51]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[45], x[50], x[45], x[50]);
}